

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O1

long duckdb::DateDiffTernaryOperator::
     Operation<duckdb::string_t,duckdb::dtime_t,duckdb::dtime_t,long>
               (string_t part,dtime_t startdate,dtime_t enddate,ValidityMask *mask,idx_t idx)

{
  undefined1 uVar1;
  ulong uVar2;
  NotImplementedException *this;
  ulong uVar3;
  long lVar4;
  long lVar5;
  dtime_t enddate_00;
  dtime_t startdate_00;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined8 local_38;
  long local_30;
  
  local_30 = part.value._8_8_;
  local_38 = part.value._0_8_;
  startdate_00.micros = (int64_t)local_78;
  enddate_00.micros = local_30;
  if ((local_38 & 0xffffffff) < 0xd) {
    enddate_00.micros = (long)&local_38 + 4;
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,enddate_00.micros,(local_38 & 0xffffffff) + enddate_00.micros);
  uVar1 = duckdb::GetDatePartSpecifier((string *)local_78);
  switch(uVar1) {
  case 0:
    DateDiff::YearOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00)
    ;
  case 1:
    DateDiff::MonthOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case 2:
  case 0xb:
  case 0xc:
  case 0x10:
  case 0x17:
    DateDiff::DayOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00);
  case 3:
    DateDiff::DecadeOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case 4:
    DateDiff::CenturyOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case 5:
    DateDiff::MilleniumOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case 6:
    lVar5 = enddate.micros - startdate.micros;
    goto LAB_005f644d;
  case 7:
    lVar5 = enddate.micros / 1000;
    uVar3 = SUB168(SEXT816(startdate.micros) * SEXT816(-0x20c49ba5e353f7cf),8);
    uVar2 = uVar3 >> 0x3f;
    lVar4 = (long)uVar3 >> 7;
    break;
  case 8:
  case 0x16:
    lVar5 = enddate.micros / 1000000;
    uVar3 = SUB168(SEXT816(startdate.micros) * SEXT816(-0x431bde82d7b634db),8);
    uVar2 = uVar3 >> 0x3f;
    lVar4 = (long)uVar3 >> 0x12;
    break;
  case 9:
    lVar5 = enddate.micros / 60000000;
    uVar3 = SUB168(SEXT816(startdate.micros) * SEXT816(0x70d59cc6bc5928d7),8) - startdate.micros;
    uVar2 = uVar3 >> 0x3f;
    lVar4 = (long)uVar3 >> 0x19;
    break;
  case 10:
    lVar5 = enddate.micros / 3600000000;
    uVar3 = SUB168(SEXT816(startdate.micros) * SEXT816(0x674a40d3fc1ad63b),8) - startdate.micros;
    uVar2 = uVar3 >> 0x3f;
    lVar4 = (long)uVar3 >> 0x1f;
    break;
  case 0xd:
  case 0x11:
    DateDiff::WeekOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00)
    ;
  case 0xe:
    DateDiff::ISOYearOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case 0xf:
    DateDiff::QuarterOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"Specifier type not implemented for DATEDIFF","");
    duckdb::NotImplementedException::NotImplementedException(this,(string *)local_58);
    __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar5 = lVar4 + uVar2 + lVar5;
LAB_005f644d:
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  return lVar5;
}

Assistant:

static inline TR Operation(TS part, TA startdate, TB enddate, ValidityMask &mask, idx_t idx) {
		if (Value::IsFinite(startdate) && Value::IsFinite(enddate)) {
			return DifferenceDates<TA, TB, TR>(GetDatePartSpecifier(part.GetString()), startdate, enddate);
		} else {
			mask.SetInvalid(idx);
			return TR();
		}
	}